

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.cpp
# Opt level: O0

bool spvOperandIsConcreteMask(spv_operand_type_t type)

{
  bool local_9;
  spv_operand_type_t type_local;
  
  if ((((type - SPV_OPERAND_TYPE_IMAGE < 7) || (type == SPV_OPERAND_TYPE_DEBUG_INFO_FLAGS)) ||
      (type == SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_INFO_FLAGS)) ||
     (((type == SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_OPERANDS ||
       (type == SPV_OPERAND_TYPE_RAW_ACCESS_CHAIN_OPERANDS)) ||
      (type - SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_REDUCE < 3)))) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool spvOperandIsConcreteMask(spv_operand_type_t type) {
  switch (type) {
    case SPV_OPERAND_TYPE_IMAGE:
    case SPV_OPERAND_TYPE_FP_FAST_MATH_MODE:
    case SPV_OPERAND_TYPE_SELECTION_CONTROL:
    case SPV_OPERAND_TYPE_LOOP_CONTROL:
    case SPV_OPERAND_TYPE_FUNCTION_CONTROL:
    case SPV_OPERAND_TYPE_MEMORY_ACCESS:
    case SPV_OPERAND_TYPE_FRAGMENT_SHADING_RATE:
    case SPV_OPERAND_TYPE_DEBUG_INFO_FLAGS:
    case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_INFO_FLAGS:
    case SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_OPERANDS:
    case SPV_OPERAND_TYPE_MATRIX_MULTIPLY_ACCUMULATE_OPERANDS:
    case SPV_OPERAND_TYPE_RAW_ACCESS_CHAIN_OPERANDS:
    case SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_REDUCE:
    case SPV_OPERAND_TYPE_TENSOR_ADDRESSING_OPERANDS:
      return true;
    default:
      break;
  }
  return false;
}